

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorExpressionNode.cxx
# Opt level: O0

void reportError(cmGeneratorExpressionContext *context,string *expr,string *result)

{
  ostream *poVar1;
  cmake *this;
  string local_1c8;
  ostringstream local_198 [8];
  ostringstream e;
  string *result_local;
  string *expr_local;
  cmGeneratorExpressionContext *context_local;
  
  context->HadError = true;
  if ((context->Quiet & 1U) == 0) {
    std::__cxx11::ostringstream::ostringstream(local_198);
    poVar1 = std::operator<<((ostream *)local_198,"Error evaluating generator expression:\n");
    poVar1 = std::operator<<(poVar1,"  ");
    poVar1 = std::operator<<(poVar1,(string *)expr);
    poVar1 = std::operator<<(poVar1,"\n");
    std::operator<<(poVar1,(string *)result);
    this = cmLocalGenerator::GetCMakeInstance(context->LG);
    std::__cxx11::ostringstream::str();
    cmake::IssueMessage(this,FATAL_ERROR,&local_1c8,&context->Backtrace,false);
    std::__cxx11::string::~string((string *)&local_1c8);
    std::__cxx11::ostringstream::~ostringstream(local_198);
  }
  return;
}

Assistant:

void reportError(cmGeneratorExpressionContext *context,
                 const std::string &expr, const std::string &result)
{
  context->HadError = true;
  if (context->Quiet)
    {
    return;
    }

  std::ostringstream e;
  e << "Error evaluating generator expression:\n"
    << "  " << expr << "\n"
    << result;
  context->LG->GetCMakeInstance()
    ->IssueMessage(cmake::FATAL_ERROR, e.str(),
                    context->Backtrace);
}